

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugallocation.cc
# Opt level: O1

void * operator_new(size_t size,nothrow_t *param_2)

{
  void *p;
  size_t local_28;
  debug_alloc_retry_data data;
  
  p = DebugAllocate(size,-0x145237f);
  if (p == (void *)0x0) {
    data.size._0_4_ = 0xfebadc81;
    local_28 = size;
    p = anon_unknown.dwarf_5160::handle_oom(retry_debug_allocate,&local_28,true,true);
  }
  if (base::internal::new_hooks_ != 0) {
    tcmalloc::InvokeNewHookSlow(p,size);
  }
  return p;
}

Assistant:

PERFTOOLS_DLL_DECL void* tc_new_nothrow(size_t size, const std::nothrow_t&) PERFTOOLS_NOTHROW {
  void* ptr = debug_cpp_alloc(size, MallocBlock::kNewType, true);
  tcmalloc::InvokeNewHook(ptr, size);
  return ptr;
}